

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

uint16_t __thiscall create::Packet::getData(Packet *this)

{
  uint16_t uVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  Packet *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->dataMutex);
  uVar1 = this->data;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return uVar1;
}

Assistant:

uint16_t Packet::getData() const {
    std::lock_guard<std::mutex> lock(dataMutex);
    return data;
  }